

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O0

void __thiscall slang::SmallVector<int,_32UL>::SmallVector(void *param_1)

{
  size_type in_stack_ffffffffffffffd8;
  SmallVectorBase<int> *in_stack_ffffffffffffffe0;
  
  SmallVectorBase<int>::SmallVectorBase((SmallVectorBase<int> *)param_1,0x20);
  SmallVectorBase<int>::reserve(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

explicit SmallVector(size_type capacity, UninitializedTag) : Base(N) {
        this->reserve(capacity);
    }